

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O0

bool __thiscall Tile::isDataEqual(Tile *this,Tile *anotherTile)

{
  int local_24;
  int count;
  Tile *anotherTile_local;
  Tile *this_local;
  
  for (local_24 = 0; (local_24 < 0x40 && (this->data[local_24] == anotherTile->data[local_24]));
      local_24 = local_24 + 1) {
  }
  return local_24 == 0x40;
}

Assistant:

bool Tile::isDataEqual(Tile *anotherTile) {
    int count = 0;
    for (; count < NUM_PIXELS_IN_TILE; count++) {
        if (data[count] != anotherTile->data[count]) {
            break;
        }
    }
    if (count == NUM_PIXELS_IN_TILE) {
        return true;
    }
    return false;
}